

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorShower::setRgb(QColorShower *this,QRgb rgb)

{
  QLineEdit *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_58;
  QColor local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->rgbOriginal = true;
  this->curCol = rgb;
  rgb2hsv(rgb,&this->hue,&this->sat,&this->val);
  QColSpinBox::setValue(this->hEd,this->hue);
  QColSpinBox::setValue(this->sEd,this->sat);
  QColSpinBox::setValue(this->vEd,this->val);
  QColSpinBox::setValue(this->rEd,(uint)*(byte *)((long)&this->curCol + 2));
  QColSpinBox::setValue(this->gEd,(uint)*(byte *)((long)&this->curCol + 1));
  QColSpinBox::setValue(this->bEd,(uint)(byte)this->curCol);
  this_00 = this->htEd;
  QColor::QColor(&local_40,rgb);
  QColor::name((NameFormat)&QStack_58);
  QLineEdit::setText(this_00,(QString *)&QStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
  showCurrentColor(this);
  updateQColor(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::setRgb(QRgb rgb)
{
    rgbOriginal = true;
    curCol = rgb;

    rgb2hsv(currentColor(), hue, sat, val);

    hEd->setValue(hue);
    sEd->setValue(sat);
    vEd->setValue(val);

    rEd->setValue(qRed(currentColor()));
    gEd->setValue(qGreen(currentColor()));
    bEd->setValue(qBlue(currentColor()));

    htEd->setText(QColor(rgb).name());

    showCurrentColor();
    updateQColor();
}